

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

void pnga_add_patch(void *alpha,Integer g_a,Integer *alo,Integer *ahi,void *beta,Integer g_b,
                   Integer *blo,Integer *bhi,Integer g_c,Integer *clo,Integer *chi)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Integer IVar5;
  Integer IVar6;
  Integer IVar7;
  logical lVar8;
  Integer *in_RCX;
  Integer *in_RDX;
  Integer in_RSI;
  Integer in_R9;
  Integer *in_stack_00000008;
  Integer *in_stack_00000010;
  Integer in_stack_00000018;
  Integer *in_stack_00000020;
  Integer last;
  Integer jtot;
  Integer offset;
  Integer lod [7];
  Integer idx;
  _iterator_hdl hdl_c;
  _iterator_hdl hdl_b;
  _iterator_hdl hdl_a;
  int local_sync_end;
  int local_sync_begin;
  char notrans;
  char *tempname;
  Integer num_blocks_c;
  Integer num_blocks_b;
  Integer num_blocks_a;
  Integer nproc;
  Integer B_created;
  Integer A_created;
  Integer me;
  Integer g_B;
  Integer g_A;
  Integer btotal;
  Integer atotal;
  Integer n1dim;
  char *C_ptr;
  char *B_ptr;
  char *A_ptr;
  Integer ldC [7];
  Integer hiC [7];
  Integer loC [7];
  Integer ldB [7];
  Integer hiB [7];
  Integer loB [7];
  Integer ldA [7];
  Integer hiA [7];
  Integer loA [7];
  Integer cdims [7];
  Integer cndim;
  Integer bdims [7];
  Integer bndim;
  Integer adims [7];
  Integer andim;
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer compatible_b;
  Integer compatible_a;
  Integer j;
  Integer i;
  char *in_stack_fffffffffffff288;
  Integer in_stack_fffffffffffff290;
  void *in_stack_fffffffffffff298;
  Integer in_stack_fffffffffffff2a0;
  Integer *in_stack_fffffffffffff2b8;
  char **in_stack_fffffffffffff2c0;
  Integer *in_stack_fffffffffffff2c8;
  Integer *in_stack_fffffffffffff2d0;
  _iterator_hdl *in_stack_fffffffffffff2d8;
  _iterator_hdl *in_stack_fffffffffffff348;
  Integer in_stack_fffffffffffff350;
  Integer *in_stack_fffffffffffff388;
  Integer *in_stack_fffffffffffff390;
  Integer *in_stack_fffffffffffff398;
  Integer in_stack_fffffffffffff3a0;
  void *in_stack_fffffffffffff3a8;
  Integer in_stack_fffffffffffff3b0;
  Integer *in_stack_fffffffffffff3b8;
  Integer *in_stack_fffffffffffff3c0;
  void *in_stack_fffffffffffff3c8;
  void *in_stack_fffffffffffff3d0;
  void *in_stack_fffffffffffff3d8;
  Integer in_stack_fffffffffffff3e0;
  Integer *in_stack_fffffffffffff3f0;
  void *in_stack_fffffffffffff3f8;
  void *in_stack_fffffffffffff400;
  void *in_stack_fffffffffffff408;
  Integer in_stack_fffffffffffff418;
  char *in_stack_fffffffffffff420;
  Integer *in_stack_fffffffffffff488;
  Integer *in_stack_fffffffffffff490;
  Integer *in_stack_fffffffffffff498;
  Integer in_stack_fffffffffffff4a0;
  char *in_stack_fffffffffffff4f8;
  Integer *in_stack_fffffffffffff500;
  Integer in_stack_fffffffffffff508;
  Integer *in_stack_fffffffffffff588;
  Integer *in_stack_fffffffffffff590;
  Integer in_stack_fffffffffffff598;
  Integer in_stack_fffffffffffff5a0;
  Integer *in_stack_fffffffffffff660;
  void *in_stack_fffffffffffff668;
  Integer *in_stack_fffffffffffff670;
  Integer *in_stack_fffffffffffff678;
  Integer in_stack_fffffffffffff680;
  void *in_stack_fffffffffffff708;
  Integer *in_stack_fffffffffffff710;
  Integer *in_stack_fffffffffffff718;
  Integer in_stack_fffffffffffff720;
  Integer local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  Integer local_338 [8];
  Integer local_2f8 [2];
  Integer *in_stack_fffffffffffffd18;
  Integer in_stack_fffffffffffffd20;
  Integer *in_stack_fffffffffffffd28;
  Integer *in_stack_fffffffffffffd30;
  Integer in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  Integer *in_stack_fffffffffffffd50;
  Integer local_278 [8];
  Integer local_238 [16];
  Integer local_1b8 [8];
  Integer local_178 [8];
  long local_138 [7];
  long local_100;
  long local_f8 [7];
  long local_c0;
  long local_b8 [8];
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  Integer local_38;
  Integer *local_28;
  Integer *local_20;
  Integer local_18;
  
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pnga_nodeid();
  bVar1 = false;
  bVar2 = false;
  pnga_nnodes();
  iVar3 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar4 != 0) {
    pnga_sync();
  }
  pnga_inquire(in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               in_stack_fffffffffffff488);
  pnga_inquire(in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               in_stack_fffffffffffff488);
  pnga_inquire(in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               in_stack_fffffffffffff488);
  if ((local_60 != local_68) || (local_60 != local_70)) {
    pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  }
  for (local_40 = 0; local_40 < local_78; local_40 = local_40 + 1) {
    if ((local_20[local_40] < 1) || (local_b8[local_40] < local_28[local_40])) {
      pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    }
  }
  for (local_40 = 0; local_40 < local_c0; local_40 = local_40 + 1) {
    if ((in_stack_00000008[local_40] < 1) || (local_f8[local_40] < in_stack_00000010[local_40])) {
      pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    }
  }
  for (local_40 = 0; local_40 < local_100; local_40 = local_40 + 1) {
    if ((in_stack_00000020[local_40] < 1) || (local_138[local_40] < *(long *)(last + local_40 * 8)))
    {
      pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    }
  }
  local_398 = 1;
  for (local_40 = 0; local_40 < local_100; local_40 = local_40 + 1) {
    local_398 = ((*(long *)(last + local_40 * 8) - in_stack_00000020[local_40]) + 1) * local_398;
  }
  local_3a0 = 1;
  for (local_40 = 0; local_40 < local_78; local_40 = local_40 + 1) {
    local_3a0 = ((local_28[local_40] - local_20[local_40]) + 1) * local_3a0;
  }
  local_3a8 = 1;
  for (local_40 = 0; local_40 < local_c0; local_40 = local_40 + 1) {
    local_3a8 = ((in_stack_00000010[local_40] - in_stack_00000008[local_40]) + 1) * local_3a8;
  }
  if ((local_3a0 != local_398) || (local_3a8 != local_398)) {
    pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  }
  IVar5 = pnga_total_blocks(local_18);
  IVar6 = pnga_total_blocks(local_38);
  IVar7 = pnga_total_blocks(in_stack_00000018);
  if (((IVar5 < 0) && (IVar6 < 0)) && (IVar7 < 0)) {
    pnga_distribution(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                      in_stack_fffffffffffff588);
    pnga_distribution(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                      in_stack_fffffffffffff588);
    pnga_distribution(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                      in_stack_fffffffffffff588);
    lVar8 = pnga_comp_patch(local_78,local_178,local_1b8,local_100,local_2f8,local_338);
    if ((lVar8 == 0) ||
       (lVar8 = pnga_comp_patch(local_78,local_20,local_28,local_100,in_stack_00000020,
                                (Integer *)last), lVar8 == 0)) {
      local_50 = 0;
    }
    else {
      local_50 = 1;
    }
    pnga_type_f2c(0x3f2);
    pnga_gop(in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290,
             in_stack_fffffffffffff288);
    lVar8 = pnga_comp_patch(local_c0,local_238,local_278,local_100,local_2f8,local_338);
    if ((lVar8 == 0) ||
       (lVar8 = pnga_comp_patch(local_c0,in_stack_00000008,in_stack_00000010,local_100,
                                in_stack_00000020,(Integer *)last), lVar8 == 0)) {
      local_58 = 0;
    }
    else {
      local_58 = 1;
    }
    pnga_type_f2c(0x3f2);
    pnga_gop(in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290,
             in_stack_fffffffffffff288);
    if ((local_50 == 0) || (local_58 == 0)) {
      if ((local_50 == 0) && (local_58 != 0)) {
        if (local_38 == in_stack_00000018) {
          lVar8 = pnga_duplicate(in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                                 in_stack_fffffffffffff4f8);
          if (lVar8 == 0) {
            pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
          }
          pnga_copy_patch(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                          in_stack_fffffffffffffd50);
          local_78 = local_100;
          bVar1 = true;
          pnga_distribution(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                            in_stack_fffffffffffff590,in_stack_fffffffffffff588);
          local_3b0 = in_RSI;
        }
        else {
          pnga_copy_patch(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                          in_stack_fffffffffffffd50);
          local_78 = local_100;
          local_3b0 = in_stack_00000018;
          pnga_distribution(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                            in_stack_fffffffffffff590,in_stack_fffffffffffff588);
        }
        if (local_c0 < local_78) {
          local_100 = local_c0;
        }
        if (local_78 < local_c0) {
          local_100 = local_78;
        }
        lVar8 = pnga_comp_patch(local_78,local_178,local_1b8,local_100,local_2f8,local_338);
        if (lVar8 == 0) {
          pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        }
        lVar8 = pnga_comp_patch(local_c0,local_238,local_278,local_100,local_2f8,local_338);
        if (lVar8 == 0) {
          pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        }
        lVar8 = pnga_patch_intersect
                          (in_stack_00000020,(Integer *)last,local_2f8,local_338,local_100);
        if (lVar8 != 0) {
          pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                          in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                          in_stack_fffffffffffff660);
          pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                          in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                          in_stack_fffffffffffff660);
          pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                          in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                          in_stack_fffffffffffff660);
          snga_add_patch_values
                    (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                     (Integer)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                     in_stack_fffffffffffff3b8,in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,
                     in_stack_fffffffffffff400,in_stack_fffffffffffff408);
          pnga_release(local_3b0,local_2f8,local_338);
          pnga_release(in_R9,local_2f8,local_338);
          pnga_release_update(in_stack_00000018,local_2f8,local_338);
        }
      }
      else if ((local_50 == 0) || (local_58 != 0)) {
        if ((local_50 == 0) && (local_58 == 0)) {
          lVar8 = pnga_duplicate(in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                                 in_stack_fffffffffffff4f8);
          if (lVar8 == 0) {
            pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
          }
          pnga_copy_patch(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                          in_stack_fffffffffffffd50);
          local_c0 = local_100;
          bVar2 = true;
          pnga_copy_patch(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                          in_stack_fffffffffffffd50);
          pnga_scale_patch(in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                           in_stack_fffffffffffff710,in_stack_fffffffffffff708);
          lVar8 = pnga_patch_intersect
                            (in_stack_00000020,(Integer *)last,local_2f8,local_338,local_100);
          if (lVar8 != 0) {
            pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                            in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                            in_stack_fffffffffffff660);
            pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                            in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                            in_stack_fffffffffffff660);
            snga_acc_patch_values
                      (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0
                       ,in_stack_fffffffffffff398,in_stack_fffffffffffff390,
                       in_stack_fffffffffffff388,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3c8
                      );
            pnga_release(in_R9,local_2f8,local_338);
            pnga_release_update(in_stack_00000018,local_2f8,local_338);
          }
        }
      }
      else {
        lVar8 = pnga_duplicate(in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                               in_stack_fffffffffffff4f8);
        if (lVar8 == 0) {
          pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        }
        pnga_copy_patch(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                        in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                        in_stack_fffffffffffffd50);
        local_c0 = local_100;
        bVar2 = true;
        pnga_distribution(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                          in_stack_fffffffffffff590,in_stack_fffffffffffff588);
        if (local_c0 < local_78) {
          local_100 = local_c0;
        }
        if (local_78 < local_c0) {
          local_100 = local_78;
        }
        lVar8 = pnga_comp_patch(local_78,local_178,local_1b8,local_100,local_2f8,local_338);
        if (lVar8 == 0) {
          pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        }
        lVar8 = pnga_comp_patch(local_c0,local_238,local_278,local_100,local_2f8,local_338);
        if (lVar8 == 0) {
          pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        }
        lVar8 = pnga_patch_intersect
                          (in_stack_00000020,(Integer *)last,local_2f8,local_338,local_100);
        if (lVar8 != 0) {
          pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                          in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                          in_stack_fffffffffffff660);
          pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                          in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                          in_stack_fffffffffffff660);
          pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                          in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                          in_stack_fffffffffffff660);
          snga_add_patch_values
                    (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                     (Integer)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                     in_stack_fffffffffffff3b8,in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,
                     in_stack_fffffffffffff400,in_stack_fffffffffffff408);
          pnga_release(in_RSI,local_2f8,local_338);
          pnga_release(in_R9,local_2f8,local_338);
          pnga_release_update(in_stack_00000018,local_2f8,local_338);
        }
      }
    }
    else {
      if (local_c0 < local_78) {
        local_100 = local_c0;
      }
      if (local_78 < local_c0) {
        local_100 = local_78;
      }
      lVar8 = pnga_comp_patch(local_78,local_178,local_1b8,local_100,local_2f8,local_338);
      if (lVar8 == 0) {
        pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      }
      lVar8 = pnga_comp_patch(local_c0,local_238,local_278,local_100,local_2f8,local_338);
      if (lVar8 == 0) {
        pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      }
      lVar8 = pnga_patch_intersect(in_stack_00000020,(Integer *)last,local_2f8,local_338,local_100);
      if (lVar8 != 0) {
        pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                        in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                        in_stack_fffffffffffff660);
        pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                        in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                        in_stack_fffffffffffff660);
        pnga_access_ptr(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                        in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                        in_stack_fffffffffffff660);
        snga_add_patch_values
                  (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                   (Integer)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                   in_stack_fffffffffffff3b8,in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,
                   in_stack_fffffffffffff400,in_stack_fffffffffffff408);
        pnga_release(in_RSI,local_2f8,local_338);
        pnga_release(in_R9,local_2f8,local_338);
        pnga_release_update(in_stack_00000018,local_2f8,local_338);
      }
    }
  }
  else {
    lVar8 = pnga_duplicate(in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                           in_stack_fffffffffffff4f8);
    if (lVar8 == 0) {
      pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    }
    pnga_copy_patch(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                    in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                    in_stack_fffffffffffffd50);
    local_78 = local_100;
    bVar1 = true;
    lVar8 = pnga_duplicate(in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                           in_stack_fffffffffffff4f8);
    if (lVar8 == 0) {
      pnga_error(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    }
    pnga_copy_patch(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                    in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                    in_stack_fffffffffffffd50);
    local_c0 = local_100;
    bVar2 = true;
    pnga_local_iterator_init(in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    pnga_local_iterator_init(in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    pnga_local_iterator_init(in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    while (iVar4 = pnga_local_iterator_next
                             (in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,
                              in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
                              in_stack_fffffffffffff2b8), iVar4 != 0) {
      pnga_local_iterator_next
                (in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                 in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
      pnga_local_iterator_next
                (in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                 in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
      for (local_48 = 0; local_48 < local_100; local_48 = local_48 + 1) {
        *(Integer *)(&stack0xfffffffffffff2b8 + local_48 * 8) = local_2f8[local_48];
      }
      lVar8 = pnga_patch_intersect(in_stack_00000020,(Integer *)last,local_2f8,local_338,local_100);
      if (lVar8 != 0) {
        for (local_48 = 0; local_48 < local_100 + -1; local_48 = local_48 + 1) {
        }
        in_stack_fffffffffffff298 = (void *)(local_70 + -0x3e9);
        switch(in_stack_fffffffffffff298) {
        case (void *)0x0:
          break;
        case (void *)0x1:
          break;
        case (void *)0x2:
          break;
        case (void *)0x3:
          break;
        default:
          break;
        case (void *)0x5:
          break;
        case (void *)0x6:
          break;
        case (void *)0xf:
        }
        snga_add_patch_values
                  (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                   (Integer)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                   in_stack_fffffffffffff3b8,in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,
                   in_stack_fffffffffffff400,in_stack_fffffffffffff408);
      }
    }
  }
  if (bVar1) {
    pnga_destroy((Integer)in_stack_fffffffffffff298);
  }
  if (bVar2) {
    pnga_destroy((Integer)in_stack_fffffffffffff298);
  }
  if (iVar3 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_add_patch(alpha, g_a, alo, ahi, beta,  g_b, blo, bhi,
                         g_c, clo, chi)
Integer g_a, *alo, *ahi;    /* patch of g_a */
Integer g_b, *blo, *bhi;    /* patch of g_b */
Integer g_c, *clo, *chi;    /* patch of g_c */
void *alpha, *beta;
{
  Integer i, j;
  Integer compatible_a, compatible_b;
  Integer atype, btype, ctype;
  Integer andim, adims[MAXDIM], bndim, bdims[MAXDIM], cndim, cdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer loC[MAXDIM], hiC[MAXDIM], ldC[MAXDIM];
  char *A_ptr, *B_ptr, *C_ptr;
  Integer n1dim;
  Integer atotal, btotal;
  Integer g_A = g_a, g_B = g_b;
  Integer me= pnga_nodeid(), A_created=0, B_created=0;
  Integer nproc = pnga_nnodes();
  Integer num_blocks_a, num_blocks_b, num_blocks_c;
  char *tempname = "temp", notrans='n';
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  pnga_inquire(g_c, &ctype, &cndim, cdims);

  if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);
  for(i=0; i<cndim; i++)
    if(clo[i] <= 0 || chi[i] > cdims[i])
      pnga_error("g_c indices out of range ", g_c);

  /* check if numbers of elements in patches match each other */
  n1dim = 1; for(i=0; i<cndim; i++) n1dim *= (chi[i] - clo[i] + 1);
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if((atotal != n1dim) || (btotal != n1dim))
    pnga_error("  capacities of patches do not match ", 0L);

  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  num_blocks_c = pnga_total_blocks(g_c);

  if (num_blocks_a < 0 && num_blocks_b < 0 && num_blocks_c < 0) {
    /* find out coordinates of patches of g_a, g_b and g_c that I own */
    pnga_distribution( g_A, me, loA, hiA);
    pnga_distribution( g_B, me, loB, hiB);
    pnga_distribution( g_c, me, loC, hiC);

    /* test if the local portion of patches matches */
    if(pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC) &&
       pnga_comp_patch(andim, alo, ahi, cndim, clo, chi)) compatible_a = 1;
    else compatible_a = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_a, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_a, 1, "&&");
    if(pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC) &&
       pnga_comp_patch(bndim, blo, bhi, cndim, clo, chi)) compatible_b = 1;
    else compatible_b = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_b, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_b, 1, "&&");
    if (compatible_a && compatible_b) {
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;

      if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
        pnga_error(" A patch mismatch ", g_A); 
      if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
        pnga_error(" B patch mismatch ", g_B);

      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else if (!compatible_a && compatible_b) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - do C<= A
       */
      if(g_b != g_c) {
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_c, clo, chi);
        andim = cndim;
        g_A = g_c;
        pnga_distribution(g_A, me, loA, hiA);
      } else {
        if (!pnga_duplicate(g_c, &g_A, tempname))
          pnga_error("ga_dadd_patch: dup failed", 0L);
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
        andim = cndim;
        A_created = 1;
        pnga_distribution(g_A, me, loA, hiA);
      }
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;

      if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
        pnga_error(" A patch mismatch ", g_A); 
      if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
        pnga_error(" B patch mismatch ", g_B);

      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else if (compatible_a && !compatible_b) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_c, &g_B, tempname))
        pnga_error("ga_dadd_patch: dup failed", 0L);
      pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
      bndim = cndim;
      B_created = 1;
      pnga_distribution(g_B, me, loB, hiB);

      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;

      if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
        pnga_error(" A patch mismatch ", g_A); 
      if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
        pnga_error(" B patch mismatch ", g_B);

      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else if (!compatible_a && !compatible_b) {
      /* there is no match between any of the global arrays */
      if (!pnga_duplicate(g_c, &g_B, tempname))
        pnga_error("ga_dadd_patch: dup failed", 0L);
      pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
      bndim = cndim;
      B_created = 1;
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;
      cndim = bndim;
      pnga_copy_patch(&notrans, g_a, alo, ahi, g_c, clo, chi);
      pnga_scale_patch(g_c, clo, chi, alpha);
      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_acc_patch_values(atype, beta, cndim, loC, hiC, ldC,
                              B_ptr, C_ptr);
        /* release access to the data */
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    }
  } else {
    _iterator_hdl hdl_a, hdl_b, hdl_c;
    /* create copies of arrays A and B that are identically distributed
       as C*/
    if (!pnga_duplicate(g_c, &g_A, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
    andim = cndim;
    A_created = 1;

    if (!pnga_duplicate(g_c, &g_B, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
    bndim = cndim;
    B_created = 1;

#if 1
    pnga_local_iterator_init(g_A, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    pnga_local_iterator_init(g_c, &hdl_c);
    while (pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC)) {
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer offset, jtot, last;
      pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
      pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);
      /* make temporary copies of loC and hiC since pnga_patch_intersect
         destroys original versions */
      for (j=0; j<cndim; j++) {
        lod[j] = loC[j];
        /*hid[j] = hiC[j];*/
      }
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {

        /* evaluate offsets for system */
        offset = 0;
        last = cndim - 1;
        jtot = 1;
        for (j=0; j<last; j++) {
          offset += (loC[j] - lod[j])*jtot;
          jtot *= ldC[j];
        }
        offset += (loC[last]-lod[last])*jtot;

        switch(ctype) {
          case C_DBL:
            A_ptr = (void*)((double*)(A_ptr) + offset);
            B_ptr = (void*)((double*)(B_ptr) + offset);
            C_ptr = (void*)((double*)(C_ptr) + offset);
            break;
          case C_INT:
            A_ptr = (void*)((int*)(A_ptr) + offset);
            B_ptr = (void*)((int*)(B_ptr) + offset);
            C_ptr = (void*)((int*)(C_ptr) + offset);
            break;
          case C_DCPL:
            A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
            break;
          case C_SCPL:
            A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
            break;
          case C_FLOAT:
            A_ptr = (void*)((float*)(A_ptr) + offset);
            B_ptr = (void*)((float*)(B_ptr) + offset);
            C_ptr = (void*)((float*)(C_ptr) + offset);
            break;
          case C_LONG:
            A_ptr = (void*)((long*)(A_ptr) + offset);
            B_ptr = (void*)((long*)(B_ptr) + offset);
            C_ptr = (void*)((long*)(C_ptr) + offset);
            break;
          case C_LONGLONG:
            A_ptr = (void*)((long long*)(A_ptr) + offset);
            B_ptr = (void*)((long long*)(B_ptr) + offset);
            C_ptr = (void*)((long long*)(C_ptr) + offset);
            break;
          default:
            break;
        }
        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);
      }
    }
#else
    /* C is normally distributed so just add copies together for regular
       arrays */
    if (num_blocks_c < 0) {
      pnga_distribution(g_c, me, loC, hiC);
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else {
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer offset, jtot, last;
      /* Simple block-cyclic data disribution */
      if (!pnga_uses_proc_grid(g_c)) {
        for (idx = me; idx < num_blocks_c; idx += nproc) {
          pnga_distribution(g_c, idx, loC, hiC);
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /*hid[j] = hiC[j];*/
          }
          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_ptr(g_A, idx, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, idx, &B_ptr, ldB);
            pnga_access_block_ptr(g_c, idx, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;

            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                C_ptr = (void*)((long long*)(C_ptr) + offset);
                break;
              default:
                break;
            }
            snga_add_patch_values(atype, alpha, beta, cndim,
                loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

            /* release access to the data */
            pnga_release_block       (g_A, idx);
            pnga_release_block       (g_B, idx); 
            pnga_release_update_block(g_c, idx); 
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer lod[MAXDIM]/*, hid[MAXDIM], chk*/;
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_c, me, proc_index);
        pnga_get_proc_index(g_c, me, index);
        pnga_get_block_info(g_c, blocks, block_dims);
        pnga_get_proc_grid(g_c, topology);
        while (index[cndim-1] < blocks[cndim-1]) {
          /* find bounding coordinates of block */
          /*chk = 1;*/
          for (i = 0; i < cndim; i++) {
            loC[i] = index[i]*block_dims[i]+1;
            hiC[i] = (index[i] + 1)*block_dims[i];
            if (hiC[i] > cdims[i]) hiC[i] = cdims[i];
            /*if (hiC[i] < loC[i]) chk = 0;*/
          }
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /*hid[j] = hiC[j];*/
          }
          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);
            pnga_access_block_grid_ptr(g_c, index, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;

            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                C_ptr = (void*)((long long*)(C_ptr) + offset);
                break;
              default:
                break;
            }
            snga_add_patch_values(atype, alpha, beta, cndim,
                loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

            /* release access to the data */
            pnga_release_block_grid       ( g_A, index);
            pnga_release_block_grid       ( g_B, index); 
            pnga_release_update_block_grid(g_c, index); 
          }

          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < cndim; i++) {
            if (index[i] >= blocks[i] && i<cndim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }

  if(A_created) pnga_destroy(g_A);
  if(B_created) pnga_destroy(g_B);

  if(local_sync_end)pnga_sync();
}